

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpath_selector.hpp
# Opt level: O2

int __thiscall
jsoncons::jsonpath::detail::
filter_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
::select(filter_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
         *this,int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
        timeval *__timeout)

{
  bool bVar1;
  size_t sVar2;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *pbVar3;
  path_node_type *ppVar4;
  undefined7 extraout_var;
  undefined4 in_register_00000034;
  eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *context;
  size_t i;
  ulong i_00;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *pkVar5;
  result_options in_stack_00000008;
  value_type r;
  error_code ec;
  value_type r_1;
  token_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  local_90;
  string_view_type local_70;
  object_range_type local_60;
  
  context = (eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
             *)CONCAT44(in_register_00000034,__nfds);
  bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_array
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)__exceptfds
                    );
  if (bVar1) {
    i_00 = 0;
    while( true ) {
      sVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size
                        ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                         __exceptfds);
      if (sVar2 <= i_00) break;
      local_60.first_.it_._M_current._0_4_ = 0;
      local_60.first_._8_8_ = std::_V2::system_category();
      pbVar3 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at
                         ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                          __exceptfds,i_00);
      token_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
      ::evaluate(&local_90,
                 (eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                  *)&this->expr_,(reference)context,(reference)__readfds,(result_options)pbVar3,
                 (error_code *)(ulong)in_stack_00000008);
      if ((int)local_60.first_.it_._M_current == 0) {
        bVar1 = is_true<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                          ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                           &local_90);
        if (bVar1) {
          ppVar4 = path_generator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                   ::generate(context,(path_node_type *)__writefds,i_00,in_stack_00000008);
          pbVar3 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at
                             ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                              __exceptfds,i_00);
          base_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
          ::tail_select(&this->
                         super_base_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                        ,context,(reference)__readfds,ppVar4,pbVar3,(node_receiver_type *)__timeout,
                        in_stack_00000008);
        }
      }
      basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::~basic_json
                ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)&local_90);
      i_00 = i_00 + 1;
    }
  }
  else {
    bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_object
                      ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                       __exceptfds);
    sVar2 = CONCAT71(extraout_var,bVar1);
    if (bVar1) {
      basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::object_range_abi_cxx11_
                (&local_60,
                 (basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)__exceptfds);
      pkVar5 = (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                *)CONCAT44(local_60.first_.it_._M_current._4_4_,(int)local_60.first_.it_._M_current)
      ;
      local_90.token_list_.
      super__Vector_base<jsoncons::jsonpath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>,_std::allocator<jsoncons::jsonpath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_60.last_.it_._M_current;
      local_90.token_list_.
      super__Vector_base<jsoncons::jsonpath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>,_std::allocator<jsoncons::jsonpath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)&this->expr_;
      while( true ) {
        bVar1 = local_60.first_.has_value_ == local_60.last_.has_value_;
        if ((local_60.first_.has_value_ & local_60.last_.has_value_ & 1U) != 0) {
          bVar1 = pkVar5 == (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                             *)local_90.token_list_.
                               super__Vector_base<jsoncons::jsonpath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>,_std::allocator<jsoncons::jsonpath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage;
        }
        sVar2 = (size_t)bVar1;
        if (bVar1 == true) break;
        local_90.
        super_expression_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
        ._vptr_expression_base._0_4_ = 0;
        local_90.token_list_.
        super__Vector_base<jsoncons::jsonpath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>,_std::allocator<jsoncons::jsonpath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)std::_V2::system_category();
        token_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
        ::evaluate((token_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                    *)&stack0xffffffffffffffc0,
                   (eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                    *)local_90.token_list_.
                      super__Vector_base<jsoncons::jsonpath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>,_std::allocator<jsoncons::jsonpath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish,(reference)context,
                   (reference)__readfds,(result_options)&pkVar5->value_,
                   (error_code *)(ulong)in_stack_00000008);
        if ((int)local_90.
                 super_expression_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                 ._vptr_expression_base == 0) {
          bVar1 = is_true<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                            ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                             &stack0xffffffffffffffc0);
          if (bVar1) {
            local_70._M_str = (pkVar5->key_)._M_dataplus._M_p;
            local_70._M_len =
                 (size_t)((anon_union_16_7_5c707707_for_token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>_3
                           *)&(pkVar5->key_)._M_string_length)->selector_;
            ppVar4 = path_generator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                     ::generate(context,(path_node_type *)__writefds,&local_70,in_stack_00000008);
            base_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
            ::tail_select(&this->
                           super_base_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                          ,context,(reference)__readfds,ppVar4,&pkVar5->value_,
                          (node_receiver_type *)__timeout,in_stack_00000008);
          }
        }
        basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::~basic_json
                  ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                   &stack0xffffffffffffffc0);
        pkVar5 = pkVar5 + 1;
      }
    }
  }
  return (int)sVar2;
}

Assistant:

void select(eval_context<Json,JsonReference>& context,
                    reference root,
                    const path_node_type& last, 
                    reference current, 
                    node_receiver_type& receiver,
                    result_options options) const override
        {
            if (current.is_array())
            {
                for (std::size_t i = 0; i < current.size(); ++i)
                {
                    std::error_code ec;
                    value_type r = expr_.evaluate(context, root, current[i], options, ec);
                    bool t = ec ? false : detail::is_true(r);
                    if (t)
                    {
                        this->tail_select(context, root, 
                                            path_generator_type::generate(context, last, i, options), 
                                            current[i], receiver, options);
                    }
                }
            }
            else if (current.is_object())
            {
                for (auto& member : current.object_range())
                {
                    std::error_code ec;
                    value_type r = expr_.evaluate(context, root, member.value(), options, ec);
                    bool t = ec ? false : detail::is_true(r);
                    if (t)
                    {
                        this->tail_select(context, root, 
                                            path_generator_type::generate(context, last, member.key(), options), 
                                            member.value(), receiver, options);
                    }
                }
            }
        }